

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldTest_SubscriptOperators_Test::
~RepeatedPtrFieldTest_SubscriptOperators_Test(RepeatedPtrFieldTest_SubscriptOperators_Test *this)

{
  RepeatedPtrFieldTest_SubscriptOperators_Test *this_local;
  
  ~RepeatedPtrFieldTest_SubscriptOperators_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RepeatedPtrFieldTest, SubscriptOperators) {
  RepeatedPtrField<std::string> field;
  *field.Add() = "1";
  EXPECT_EQ("1", field.Get(0));
  EXPECT_EQ("1", field[0]);
  EXPECT_EQ(field.Mutable(0), &field[0]);
  const RepeatedPtrField<std::string>& const_field = field;
  EXPECT_EQ(*field.data(), &const_field[0]);
}